

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall fmt::v11::format_int::format_signed<int>(format_int *this,int value)

{
  char *pcVar1;
  char *pcVar2;
  int in_ESI;
  undefined8 in_RDI;
  char *begin;
  bool negative;
  uint32_or_64_or_128_t<int> abs_value;
  format_int *in_stack_ffffffffffffffe0;
  
  pcVar1 = format_unsigned<unsigned_int>(in_stack_ffffffffffffffe0,(uint)((ulong)in_RDI >> 0x20));
  pcVar2 = pcVar1;
  if (in_ESI < 0) {
    pcVar2 = pcVar1 + -1;
    pcVar1[-1] = '-';
  }
  return pcVar2;
}

Assistant:

FMT_CONSTEXPR20 auto format_signed(Int value) -> char* {
    auto abs_value = static_cast<detail::uint32_or_64_or_128_t<Int>>(value);
    bool negative = value < 0;
    if (negative) abs_value = 0 - abs_value;
    auto begin = format_unsigned(abs_value);
    if (negative) *--begin = '-';
    return begin;
  }